

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O2

int run_test_connection_fail_doesnt_auto_close(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_a;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&timer);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    connection_fail(on_connect_without_close);
    eval_a = 1;
    eval_b = (int64_t)timer_close_cb_calls;
    if (eval_b == 1) {
      eval_a = 1;
      eval_b = (int64_t)timer_cb_calls;
      if (eval_b == 1) {
        puVar2 = uv_default_loop();
        close_loop(puVar2);
        eval_a = 0;
        puVar2 = uv_default_loop();
        iVar1 = uv_loop_close(puVar2);
        eval_b = (int64_t)iVar1;
        if (eval_b == 0) {
          uv_library_shutdown();
          return 0;
        }
        pcVar5 = "uv_loop_close(uv_default_loop())";
        pcVar4 = "0";
        uVar3 = 0x9f;
      }
      else {
        pcVar5 = "timer_cb_calls";
        pcVar4 = "1";
        uVar3 = 0x9d;
      }
    }
    else {
      pcVar5 = "timer_close_cb_calls";
      pcVar4 = "1";
      uVar3 = 0x9c;
    }
  }
  else {
    pcVar5 = "0";
    pcVar4 = "r";
    uVar3 = 0x98;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-connection-fail.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(connection_fail_doesnt_auto_close) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif

  int r;

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT_OK(r);

  connection_fail(on_connect_without_close);

  ASSERT_EQ(1, timer_close_cb_calls);
  ASSERT_EQ(1, timer_cb_calls);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}